

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

bool cppforth::Forth::isValidDigit(Char c,int numericBase)

{
  uint uVar1;
  bool bVar2;
  
  uVar1 = (uint)c;
  if ((numericBase < 0xb) ||
     ((bVar2 = true, c < 0x41 || numericBase + 0x37 <= (int)uVar1 &&
      (c < 0x61 || numericBase + 0x57 <= (int)uVar1)))) {
    bVar2 = (int)uVar1 < numericBase + 0x30 && 0x2f < c;
  }
  return bVar2;
}

Assistant:

static bool isValidDigit(Char c, int numericBase) {
			if (numericBase > 10) {
				if (('A' <= c) && (c < ('A' + numericBase - 10)))
					return true;
				if (('a' <= c) && (c < ('a' + numericBase - 10)))
					return true;
			}
			return ('0' <= c) && (c < ('0' + numericBase));
		}